

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  Random *random;
  TestCase *pTVar1;
  pointer ppTVar2;
  ulong uVar3;
  
  random = &this->random_;
  ShuffleRange<int>(random,0,this->last_death_test_case_ + 1,&this->test_case_indices_);
  ShuffleRange<int>(random,this->last_death_test_case_ + 1,
                    (int)((ulong)((long)(this->test_cases_).
                                        super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->test_cases_).
                                       super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3),
                    &this->test_case_indices_);
  ppTVar2 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar2) {
    uVar3 = 0;
    do {
      pTVar1 = ppTVar2[uVar3];
      ShuffleRange<int>(random,0,(int)((ulong)((long)(pTVar1->test_indices_).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pTVar1->test_indices_).
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start) >> 2),
                        &pTVar1->test_indices_);
      uVar3 = uVar3 + 1;
      ppTVar2 = (this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test cases.
  ShuffleRange(random(), 0, last_death_test_case_ + 1, &test_case_indices_);

  // Shuffles the non-death test cases.
  ShuffleRange(random(), last_death_test_case_ + 1,
               static_cast<int>(test_cases_.size()), &test_case_indices_);

  // Shuffles the tests inside each test case.
  for (size_t i = 0; i < test_cases_.size(); i++) {
    test_cases_[i]->ShuffleTests(random());
  }
}